

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraymatcher.cpp
# Opt level: O0

qsizetype __thiscall
QByteArrayMatcher::indexIn(QByteArrayMatcher *this,char *str,qsizetype len,qsizetype from)

{
  qsizetype qVar1;
  long in_RCX;
  qsizetype in_RDX;
  uchar *in_RSI;
  long in_RDI;
  undefined8 local_20;
  
  local_20 = in_RCX;
  if (in_RCX < 0) {
    local_20 = 0;
  }
  qVar1 = bm_find(in_RSI,in_RDX,local_20,*(uchar **)(in_RDI + 0x120),*(qsizetype *)(in_RDI + 0x128),
                  (uchar *)(in_RDI + 0x20));
  return qVar1;
}

Assistant:

qsizetype QByteArrayMatcher::indexIn(const char *str, qsizetype len, qsizetype from) const
{
    if (from < 0)
        from = 0;
    return bm_find(reinterpret_cast<const uchar *>(str), len, from,
                   p.p, p.l, p.q_skiptable);
}